

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timers.cpp
# Opt level: O3

error_logger_for_timertt_t * __thiscall
so_5::timers_details::create_error_logger_for_timertt_abi_cxx11_
          (error_logger_for_timertt_t *__return_storage_ptr__,timers_details *this,
          error_logger_shptr_t *logger)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  
  uVar2 = *(undefined8 *)this;
  uVar3 = *(undefined8 *)(this + 8);
  lVar1 = *(long *)(this + 8);
  if (lVar1 != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
    }
  }
  *__return_storage_ptr__ = (error_logger_for_timertt_t)(ZEXT832(0) << 0x20);
  puVar4 = (undefined8 *)operator_new(0x10);
  *(undefined8 **)&(__return_storage_ptr__->super__Function_base)._M_functor = puVar4;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sigman78[P]sobjectizer/so_5/timers.cpp:407:10)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sigman78[P]sobjectizer/so_5/timers.cpp:407:10)>
       ::_M_manager;
  *puVar4 = uVar2;
  puVar4[1] = uVar3;
  return __return_storage_ptr__;
}

Assistant:

error_logger_for_timertt_t
create_error_logger_for_timertt( error_logger_shptr_t logger )
	{
		return [logger]( const std::string & msg ) {
			SO_5_LOG_ERROR( *logger, stream ) {
				stream << "error inside timer_thread: " << msg;
			}
		};
	}